

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O3

HRRDoubletStepList * __thiscall
OSTEI_HRR_Algorithm_Base::GetKetSteps
          (HRRDoubletStepList *__return_storage_ptr__,OSTEI_HRR_Algorithm_Base *this,DAM *am)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  const_iterator cVar2;
  mapped_type *__x;
  DAM DStack_58;
  
  DAM::notag(&DStack_58,am);
  cVar2 = std::
          _Rb_tree<DAM,_std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>,_std::_Select1st<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
          ::find(&(this->ketsteps_)._M_t,&DStack_58);
  paVar1 = &DStack_58.tag.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)DStack_58.tag._M_dataplus._M_p != paVar1) {
    operator_delete(DStack_58.tag._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)cVar2._M_node == &(this->ketsteps_)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    DAM::notag(&DStack_58,am);
    __x = std::
          map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
          ::at(&this->ketsteps_,&DStack_58);
    std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::vector(__return_storage_ptr__,__x)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)DStack_58.tag._M_dataplus._M_p != paVar1) {
      operator_delete(DStack_58.tag._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HRRDoubletStepList OSTEI_HRR_Algorithm_Base::GetKetSteps(DAM am) const
{
    if(ketsteps_.count(am.notag()))
        return ketsteps_.at(am.notag());
    else
        return HRRDoubletStepList();
}